

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O0

int arkRootInit(ARKodeMem ark_mem,int nrtfn,ARKRootFn g)

{
  ARKodeRootMem pAVar1;
  realtype *prVar2;
  int *piVar3;
  ARKRootFn in_RDX;
  int in_ESI;
  ARKodeMem in_RDI;
  int nrt;
  int i;
  int local_2c;
  int local_24;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkRootInit","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    local_2c = in_ESI;
    if (in_ESI < 0) {
      local_2c = 0;
    }
    if (in_RDI->root_mem == (ARKodeRootMem)0x0) {
      pAVar1 = (ARKodeRootMem)malloc(0x88);
      in_RDI->root_mem = pAVar1;
      if (in_RDI->root_mem == (ARKodeRootMem)0x0) {
        arkProcessError(in_RDI,0,"ARKode","arkRootInit","Allocation of arkode_mem failed.");
        return -0x14;
      }
      in_RDI->root_mem->glo = (realtype *)0x0;
      in_RDI->root_mem->ghi = (realtype *)0x0;
      in_RDI->root_mem->grout = (realtype *)0x0;
      in_RDI->root_mem->iroots = (int *)0x0;
      in_RDI->root_mem->rootdir = (int *)0x0;
      in_RDI->root_mem->gfun = (ARKRootFn)0x0;
      in_RDI->root_mem->nrtfn = 0;
      in_RDI->root_mem->irfnd = 0;
      in_RDI->root_mem->gactive = (int *)0x0;
      in_RDI->root_mem->mxgnull = 1;
      in_RDI->root_mem->root_data = in_RDI->user_data;
      in_RDI->lrw = in_RDI->lrw + 5;
      in_RDI->liw = in_RDI->liw + 0xc;
    }
    if ((local_2c != in_RDI->root_mem->nrtfn) && (0 < in_RDI->root_mem->nrtfn)) {
      free(in_RDI->root_mem->glo);
      in_RDI->root_mem->glo = (realtype *)0x0;
      free(in_RDI->root_mem->ghi);
      in_RDI->root_mem->ghi = (realtype *)0x0;
      free(in_RDI->root_mem->grout);
      in_RDI->root_mem->grout = (realtype *)0x0;
      free(in_RDI->root_mem->iroots);
      in_RDI->root_mem->iroots = (int *)0x0;
      free(in_RDI->root_mem->rootdir);
      in_RDI->root_mem->rootdir = (int *)0x0;
      free(in_RDI->root_mem->gactive);
      in_RDI->root_mem->gactive = (int *)0x0;
      in_RDI->lrw = in_RDI->lrw - (long)(in_RDI->root_mem->nrtfn * 3);
      in_RDI->liw = in_RDI->liw - (long)(in_RDI->root_mem->nrtfn * 3);
    }
    if (local_2c == 0) {
      in_RDI->root_mem->nrtfn = 0;
      in_RDI->root_mem->gfun = (ARKRootFn)0x0;
      local_4 = 0;
    }
    else if (local_2c == in_RDI->root_mem->nrtfn) {
      if (in_RDX == in_RDI->root_mem->gfun) {
        local_4 = 0;
      }
      else if (in_RDX == (ARKRootFn)0x0) {
        free(in_RDI->root_mem->glo);
        in_RDI->root_mem->glo = (realtype *)0x0;
        free(in_RDI->root_mem->ghi);
        in_RDI->root_mem->ghi = (realtype *)0x0;
        free(in_RDI->root_mem->grout);
        in_RDI->root_mem->grout = (realtype *)0x0;
        free(in_RDI->root_mem->iroots);
        in_RDI->root_mem->iroots = (int *)0x0;
        free(in_RDI->root_mem->rootdir);
        in_RDI->root_mem->rootdir = (int *)0x0;
        free(in_RDI->root_mem->gactive);
        in_RDI->root_mem->gactive = (int *)0x0;
        in_RDI->lrw = in_RDI->lrw - (long)(local_2c * 3);
        in_RDI->liw = in_RDI->liw - (long)(local_2c * 3);
        arkProcessError(in_RDI,-0x16,"ARKode","arkRootInit","g = NULL illegal.");
        local_4 = -0x16;
      }
      else {
        in_RDI->root_mem->gfun = in_RDX;
        local_4 = 0;
      }
    }
    else {
      in_RDI->root_mem->nrtfn = local_2c;
      if (in_RDX == (ARKRootFn)0x0) {
        arkProcessError(in_RDI,-0x16,"ARKode","arkRootInit","g = NULL illegal.");
        local_4 = -0x16;
      }
      else {
        in_RDI->root_mem->gfun = in_RDX;
        in_RDI->root_mem->glo = (realtype *)0x0;
        prVar2 = (realtype *)malloc((long)local_2c << 3);
        in_RDI->root_mem->glo = prVar2;
        if (in_RDI->root_mem->glo == (realtype *)0x0) {
          arkProcessError(in_RDI,-0x14,"ARKode","arkRootInit","A memory request failed.");
          local_4 = -0x14;
        }
        else {
          in_RDI->root_mem->ghi = (realtype *)0x0;
          prVar2 = (realtype *)malloc((long)local_2c << 3);
          in_RDI->root_mem->ghi = prVar2;
          if (in_RDI->root_mem->ghi == (realtype *)0x0) {
            free(in_RDI->root_mem->glo);
            in_RDI->root_mem->glo = (realtype *)0x0;
            arkProcessError(in_RDI,-0x14,"ARKode","arkRootInit","A memory request failed.");
            local_4 = -0x14;
          }
          else {
            in_RDI->root_mem->grout = (realtype *)0x0;
            prVar2 = (realtype *)malloc((long)local_2c << 3);
            in_RDI->root_mem->grout = prVar2;
            if (in_RDI->root_mem->grout == (realtype *)0x0) {
              free(in_RDI->root_mem->glo);
              in_RDI->root_mem->glo = (realtype *)0x0;
              free(in_RDI->root_mem->ghi);
              in_RDI->root_mem->ghi = (realtype *)0x0;
              arkProcessError(in_RDI,-0x14,"ARKode","arkRootInit","A memory request failed.");
              local_4 = -0x14;
            }
            else {
              in_RDI->root_mem->iroots = (int *)0x0;
              piVar3 = (int *)malloc((long)local_2c << 2);
              in_RDI->root_mem->iroots = piVar3;
              if (in_RDI->root_mem->iroots == (int *)0x0) {
                free(in_RDI->root_mem->glo);
                in_RDI->root_mem->glo = (realtype *)0x0;
                free(in_RDI->root_mem->ghi);
                in_RDI->root_mem->ghi = (realtype *)0x0;
                free(in_RDI->root_mem->grout);
                in_RDI->root_mem->grout = (realtype *)0x0;
                arkProcessError(in_RDI,-0x14,"ARKode","arkRootInit","A memory request failed.");
                local_4 = -0x14;
              }
              else {
                in_RDI->root_mem->rootdir = (int *)0x0;
                piVar3 = (int *)malloc((long)local_2c << 2);
                in_RDI->root_mem->rootdir = piVar3;
                if (in_RDI->root_mem->rootdir == (int *)0x0) {
                  free(in_RDI->root_mem->glo);
                  in_RDI->root_mem->glo = (realtype *)0x0;
                  free(in_RDI->root_mem->ghi);
                  in_RDI->root_mem->ghi = (realtype *)0x0;
                  free(in_RDI->root_mem->grout);
                  in_RDI->root_mem->grout = (realtype *)0x0;
                  free(in_RDI->root_mem->iroots);
                  in_RDI->root_mem->iroots = (int *)0x0;
                  arkProcessError(in_RDI,-0x14,"ARKode","arkRootInit","A memory request failed.");
                  local_4 = -0x14;
                }
                else {
                  in_RDI->root_mem->gactive = (int *)0x0;
                  piVar3 = (int *)malloc((long)local_2c << 2);
                  in_RDI->root_mem->gactive = piVar3;
                  if (in_RDI->root_mem->gactive == (int *)0x0) {
                    free(in_RDI->root_mem->glo);
                    in_RDI->root_mem->glo = (realtype *)0x0;
                    free(in_RDI->root_mem->ghi);
                    in_RDI->root_mem->ghi = (realtype *)0x0;
                    free(in_RDI->root_mem->grout);
                    in_RDI->root_mem->grout = (realtype *)0x0;
                    free(in_RDI->root_mem->iroots);
                    in_RDI->root_mem->iroots = (int *)0x0;
                    free(in_RDI->root_mem->rootdir);
                    in_RDI->root_mem->rootdir = (int *)0x0;
                    arkProcessError(in_RDI,-0x14,"ARKodeS","arkRootInit","A memory request failed.")
                    ;
                    local_4 = -0x14;
                  }
                  else {
                    for (local_24 = 0; local_24 < local_2c; local_24 = local_24 + 1) {
                      in_RDI->root_mem->rootdir[local_24] = 0;
                    }
                    for (local_24 = 0; local_24 < local_2c; local_24 = local_24 + 1) {
                      in_RDI->root_mem->gactive[local_24] = 1;
                    }
                    in_RDI->lrw = (long)(local_2c * 3) + in_RDI->lrw;
                    in_RDI->liw = (long)(local_2c * 3) + in_RDI->liw;
                    local_4 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int arkRootInit(ARKodeMem ark_mem, int nrtfn, ARKRootFn g)
{
  int i, nrt;

  /* Check ark_mem pointer */
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkRootInit", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  nrt = (nrtfn < 0) ? 0 : nrtfn;

  /* If unallocated, allocate rootfinding structure, set defaults, update space */
  if (ark_mem->root_mem == NULL) {
    ark_mem->root_mem = (ARKodeRootMem) malloc(sizeof(struct ARKodeRootMemRec));
    if (ark_mem->root_mem == NULL) {
      arkProcessError(ark_mem, 0, "ARKode", "arkRootInit",
                      MSG_ARK_ARKMEM_FAIL);
      return(ARK_MEM_FAIL);
    }
    ark_mem->root_mem->glo       = NULL;
    ark_mem->root_mem->ghi       = NULL;
    ark_mem->root_mem->grout     = NULL;
    ark_mem->root_mem->iroots    = NULL;
    ark_mem->root_mem->rootdir   = NULL;
    ark_mem->root_mem->gfun      = NULL;
    ark_mem->root_mem->nrtfn     = 0;
    ark_mem->root_mem->irfnd     = 0;
    ark_mem->root_mem->gactive   = NULL;
    ark_mem->root_mem->mxgnull   = 1;
    ark_mem->root_mem->root_data = ark_mem->user_data;

    ark_mem->lrw += ARK_ROOT_LRW;
    ark_mem->liw += ARK_ROOT_LIW;
  }

  /* If rerunning arkRootInit() with a different number of root
     functions (changing number of gfun components), then free
     currently held memory resources */
  if ((nrt != ark_mem->root_mem->nrtfn) && (ark_mem->root_mem->nrtfn > 0)) {
    free(ark_mem->root_mem->glo);     ark_mem->root_mem->glo     = NULL;
    free(ark_mem->root_mem->ghi);     ark_mem->root_mem->ghi     = NULL;
    free(ark_mem->root_mem->grout);   ark_mem->root_mem->grout   = NULL;
    free(ark_mem->root_mem->iroots);  ark_mem->root_mem->iroots  = NULL;
    free(ark_mem->root_mem->rootdir); ark_mem->root_mem->rootdir = NULL;
    free(ark_mem->root_mem->gactive); ark_mem->root_mem->gactive = NULL;

    ark_mem->lrw -= 3 * (ark_mem->root_mem->nrtfn);
    ark_mem->liw -= 3 * (ark_mem->root_mem->nrtfn);
  }

  /* If arkRootInit() was called with nrtfn == 0, then set
     nrtfn to zero and gfun to NULL before returning */
  if (nrt == 0) {
    ark_mem->root_mem->nrtfn = nrt;
    ark_mem->root_mem->gfun = NULL;
    return(ARK_SUCCESS);
  }

  /* If rerunning arkRootInit() with the same number of root
     functions (not changing number of gfun components), then
     check if the root function argument has changed */
  /* If g != NULL then return as currently reserved memory
     resources will suffice */
  if (nrt == ark_mem->root_mem->nrtfn) {
    if (g != ark_mem->root_mem->gfun) {
      if (g == NULL) {
        free(ark_mem->root_mem->glo);     ark_mem->root_mem->glo     = NULL;
        free(ark_mem->root_mem->ghi);     ark_mem->root_mem->ghi     = NULL;
        free(ark_mem->root_mem->grout);   ark_mem->root_mem->grout   = NULL;
        free(ark_mem->root_mem->iroots);  ark_mem->root_mem->iroots  = NULL;
        free(ark_mem->root_mem->rootdir); ark_mem->root_mem->rootdir = NULL;
        free(ark_mem->root_mem->gactive); ark_mem->root_mem->gactive = NULL;

        ark_mem->lrw -= 3*nrt;
        ark_mem->liw -= 3*nrt;

        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                        "arkRootInit", MSG_ARK_NULL_G);
        return(ARK_ILL_INPUT);
      }
      else {
        ark_mem->root_mem->gfun = g;
        return(ARK_SUCCESS);
      }
    }
    else return(ARK_SUCCESS);
  }

  /* Set variable values in ARKode memory block */
  ark_mem->root_mem->nrtfn = nrt;
  if (g == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkRootInit", MSG_ARK_NULL_G);
    return(ARK_ILL_INPUT);
  }
  else ark_mem->root_mem->gfun = g;

  /* Allocate necessary memory and return */
  ark_mem->root_mem->glo = NULL;
  ark_mem->root_mem->glo = (realtype *) malloc(nrt*sizeof(realtype));
  if (ark_mem->root_mem->glo == NULL) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->ghi = NULL;
  ark_mem->root_mem->ghi = (realtype *) malloc(nrt*sizeof(realtype));
  if (ark_mem->root_mem->ghi == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->grout = NULL;
  ark_mem->root_mem->grout = (realtype *) malloc(nrt*sizeof(realtype));
  if (ark_mem->root_mem->grout == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi); ark_mem->root_mem->ghi = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->iroots = NULL;
  ark_mem->root_mem->iroots = (int *) malloc(nrt*sizeof(int));
  if (ark_mem->root_mem->iroots == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi); ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout); ark_mem->root_mem->grout = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->rootdir = NULL;
  ark_mem->root_mem->rootdir = (int *) malloc(nrt*sizeof(int));
  if (ark_mem->root_mem->rootdir == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi); ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout); ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots); ark_mem->root_mem->iroots = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->gactive = NULL;
  ark_mem->root_mem->gactive = (booleantype *) malloc(nrt*sizeof(booleantype));
  if (ark_mem->root_mem->gactive == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi); ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout); ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots); ark_mem->root_mem->iroots = NULL;
    free(ark_mem->root_mem->rootdir); ark_mem->root_mem->rootdir = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKodeS",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }

  /* Set default values for rootdir (both directions) */
  for(i=0; i<nrt; i++) ark_mem->root_mem->rootdir[i] = 0;

  /* Set default values for gactive (all active) */
  for(i=0; i<nrt; i++) ark_mem->root_mem->gactive[i] = SUNTRUE;

  ark_mem->lrw += 3*nrt;
  ark_mem->liw += 3*nrt;

  return(ARK_SUCCESS);
}